

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

void __thiscall
google::protobuf::io::CodedOutputStream::CodedOutputStream
          (CodedOutputStream *this,ZeroCopyOutputStream *stream,bool do_eager_refresh)

{
  bool deterministic;
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  uint8_t *puVar3;
  int local_2c;
  void *pvStack_28;
  int size;
  void *data;
  ZeroCopyOutputStream *pZStack_18;
  bool do_eager_refresh_local;
  ZeroCopyOutputStream *stream_local;
  CodedOutputStream *this_local;
  
  data._7_1_ = do_eager_refresh;
  pZStack_18 = stream;
  stream_local = (ZeroCopyOutputStream *)this;
  deterministic = IsDefaultSerializationDeterministic();
  EpsCopyOutputStream::EpsCopyOutputStream(&this->impl_,stream,deterministic,&this->cur_);
  iVar1 = (*pZStack_18->_vptr_ZeroCopyOutputStream[4])();
  this->start_count_ = CONCAT44(extraout_var,iVar1);
  if ((((data._7_1_ & 1) != 0) &&
      (uVar2 = (*pZStack_18->_vptr_ZeroCopyOutputStream[2])
                         (pZStack_18,&stack0xffffffffffffffd8,&local_2c), (uVar2 & 1) != 0)) &&
     (local_2c != 0)) {
    puVar3 = EpsCopyOutputStream::SetInitialBuffer(&this->impl_,pvStack_28,local_2c);
    this->cur_ = puVar3;
  }
  return;
}

Assistant:

CodedOutputStream::CodedOutputStream(ZeroCopyOutputStream* stream,
                                     bool do_eager_refresh)
    : impl_(stream, IsDefaultSerializationDeterministic(), &cur_),
      start_count_(stream->ByteCount()) {
  if (do_eager_refresh) {
    void* data;
    int size;
    if (!stream->Next(&data, &size) || size == 0) return;
    cur_ = impl_.SetInitialBuffer(data, size);
  }
}